

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulate.cpp
# Opt level: O0

uint16_t anon_unknown.dwarf_18993::op_dec(EmulateRegisters *regs,uint16_t value,bool wide)

{
  undefined2 local_16;
  uint8_t v;
  uint16_t result;
  bool wide_local;
  uint16_t value_local;
  EmulateRegisters *regs_local;
  
  if (wide) {
    local_16 = value - 1;
  }
  else {
    local_16 = (uint16_t)(byte)((char)value - 1);
  }
  set_nz_flags(regs,local_16,wide);
  return local_16;
}

Assistant:

inline uint16_t op_dec(EmulateRegisters &regs, const uint16_t value, const bool wide) {
	// TODO-IMPROVE: Do not take regs, return mask instead
	uint16_t result = 0;
	if (wide) {
		result = value - 1;
	} else {
		uint8_t v = (uint8_t)value;
		v--;
		result = v;
	}
	set_nz_flags(regs, result, wide);
	return result;
}